

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O2

void absl::lts_20250127::debugging_internal::DumpPCAndFrameSizesAndStackTrace
               (void *pc,void **stack,int *frame_sizes,int depth,int min_dropped_frames,
               bool symbolize_stacktrace,OutputWriter *writer,void *writer_arg)

{
  void *pc_00;
  ulong uVar1;
  ulong uVar2;
  char buf [100];
  
  if (pc != (void *)0x0) {
    if (symbolize_stacktrace) {
      anon_unknown_0::DumpPCAndFrameSizeAndSymbol(writer,writer_arg,pc,pc,0,"PC: ");
    }
    else {
      anon_unknown_0::DumpPCAndFrameSize(writer,writer_arg,pc,0,"PC: ");
    }
  }
  uVar2 = 0;
  uVar1 = (ulong)(uint)depth;
  if (depth < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    pc_00 = stack[uVar2];
    if (symbolize_stacktrace) {
      anon_unknown_0::DumpPCAndFrameSizeAndSymbol
                (writer,writer_arg,pc_00,(void *)((long)pc_00 + -1),frame_sizes[uVar2],"    ");
    }
    else {
      anon_unknown_0::DumpPCAndFrameSize(writer,writer_arg,pc_00,frame_sizes[uVar2],"    ");
    }
  }
  if (0 < min_dropped_frames) {
    snprintf(buf,100,"    @ ... and at least %d more frames\n");
    (*writer)(buf,writer_arg);
  }
  return;
}

Assistant:

void DumpPCAndFrameSizesAndStackTrace(void* const pc, void* const stack[],
                                      int frame_sizes[], int depth,
                                      int min_dropped_frames,
                                      bool symbolize_stacktrace,
                                      OutputWriter* writer, void* writer_arg) {
  if (pc != nullptr) {
    // We don't know the stack frame size for PC, use 0.
    if (symbolize_stacktrace) {
      DumpPCAndFrameSizeAndSymbol(writer, writer_arg, pc, pc, 0, "PC: ");
    } else {
      DumpPCAndFrameSize(writer, writer_arg, pc, 0, "PC: ");
    }
  }
  for (int i = 0; i < depth; i++) {
    if (symbolize_stacktrace) {
      // Pass the previous address of pc as the symbol address because pc is a
      // return address, and an overrun may occur when the function ends with a
      // call to a function annotated noreturn (e.g. CHECK). Note that we don't
      // do this for pc above, as the adjustment is only correct for return
      // addresses.
      DumpPCAndFrameSizeAndSymbol(writer, writer_arg, stack[i],
                                  reinterpret_cast<char*>(stack[i]) - 1,
                                  frame_sizes[i], "    ");
    } else {
      DumpPCAndFrameSize(writer, writer_arg, stack[i], frame_sizes[i], "    ");
    }
  }
  if (min_dropped_frames > 0) {
    char buf[100];
    snprintf(buf, sizeof(buf), "    @ ... and at least %d more frames\n",
             min_dropped_frames);
    writer(buf, writer_arg);
  }
}